

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_function_body(Parser *this,LexData *lex,FunctionNode *f)

{
  CompoundStmt *pCVar1;
  FunctionNode *f_local;
  LexData *lex_local;
  Parser *this_local;
  
  std::__cxx11::string::operator=((string *)&(this->data).fn,(string *)lex);
  this->lex_data = lex;
  goto_token(this,f->body->beg_tok);
  pCVar1 = compound_statement(this);
  f->body->block = pCVar1;
  return;
}

Assistant:

void Parser::parse_function_body(const LexData& lex, FunctionNode* f)
{
  data.fn = lex.fn;
  lex_data = &lex;
  goto_token(f->body->beg_tok);
  f->body->block = compound_statement();
}